

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O0

size_t highscore_where(high_score *entry,high_score *scores,size_t sz)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  _Bool score_winner;
  _Bool entry_winner;
  long score_pts;
  long entry_pts;
  size_t i;
  size_t sz_local;
  high_score *scores_local;
  high_score *entry_local;
  
  entry_pts = 0;
  do {
    if (sz <= (ulong)entry_pts) {
      return sz - 1;
    }
    uVar3 = strtoul(entry->pts,(char **)0x0,0);
    uVar4 = strtoul(scores[entry_pts].pts,(char **)0x0,0);
    iVar1 = strcmp(entry->how,"Ripe Old Age");
    iVar2 = strcmp(scores[entry_pts].how,"Ripe Old Age");
    if ((iVar1 == 0) && (iVar2 != 0)) {
      return entry_pts;
    }
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((long)uVar4 <= (long)uVar3) {
        return entry_pts;
      }
      if (scores[entry_pts].what[0] == '\0') {
        return entry_pts;
      }
    }
    entry_pts = entry_pts + 1;
  } while( true );
}

Assistant:

size_t highscore_where(const struct high_score *entry,
					   const struct high_score scores[], size_t sz)
{
	size_t i;

	/* Read until we get to a higher score */
	for (i = 0; i < sz; i++) {
		long entry_pts = strtoul(entry->pts, NULL, 0);
		long score_pts = strtoul(scores[i].pts, NULL, 0);
		bool entry_winner = streq(entry->how, "Ripe Old Age");
		bool score_winner = streq(scores[i].how, "Ripe Old Age");

		if (entry_winner && !score_winner)
			return i;

		if (!entry_winner && score_winner)
			continue;

		if (entry_pts >= score_pts)
			return i;

		if (scores[i].what[0] == '\0')
			return i;
	}

	/* The last entry is always usable */
	return sz - 1;
}